

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxNode *args_3;
  UdpInitialStmtSyntax *pUVar1;
  DeepCloneVisitor visitor;
  Token local_70;
  Token local_60;
  Token local_50;
  Token local_40;
  
  local_60 = parsing::Token::deepClone((Token *)(__fn + 0x18),(BumpAllocator *)__child_stack);
  local_40 = parsing::Token::deepClone((Token *)(__fn + 0x28),(BumpAllocator *)__child_stack);
  local_50 = parsing::Token::deepClone((Token *)(__fn + 0x38),(BumpAllocator *)__child_stack);
  args_3 = detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x48),(DeepCloneVisitor *)&local_70,
                      (BumpAllocator *)__child_stack);
  local_70 = parsing::Token::deepClone((Token *)(__fn + 0x50),(BumpAllocator *)__child_stack);
  pUVar1 = BumpAllocator::
           emplace<slang::syntax::UdpInitialStmtSyntax,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::syntax::ExpressionSyntax&,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,&local_60,&local_40,&local_50,
                      (ExpressionSyntax *)args_3,&local_70);
  return (int)pUVar1;
}

Assistant:

static SyntaxNode* clone(const UdpInitialStmtSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<UdpInitialStmtSyntax>(
        node.initial.deepClone(alloc),
        node.name.deepClone(alloc),
        node.equals.deepClone(alloc),
        *deepClone<ExpressionSyntax>(*node.value, alloc),
        node.semi.deepClone(alloc)
    );
}